

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

void predict_or_learn_multi<false,false>(nn *n,single_learner *base,example *ec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  unsigned_long uVar9;
  code *pcVar10;
  double dVar11;
  uchar *puVar12;
  uchar *puVar13;
  size_t sVar14;
  uchar *puVar15;
  uchar *puVar16;
  uchar *puVar17;
  uchar *puVar18;
  ostream *poVar19;
  float *pfVar20;
  unsigned_long *puVar21;
  v_array<unsigned_char> *in_RDX;
  uint *in_RDI;
  float fVar22;
  uint i_2;
  features save_nn_output_namespace;
  float sqrtk;
  float wf;
  features *out_fs;
  float sigmah;
  uint i_1;
  float save_ec_loss;
  float save_final_prediction;
  float save_partial_prediction;
  bool converse;
  uint i;
  uint64_t save_ft_offset;
  ostringstream outputStringStream;
  bool *dropped_out;
  polyprediction *hiddenbias_pred;
  polyprediction *hidden_units;
  loss_function *save_loss;
  float dropscale;
  float save_max_label;
  float save_min_label;
  _func_void_shared_data_ptr_float *save_set_minmax;
  label_data ld;
  shared_data *save_sd;
  shared_data sd;
  bool shouldOutput;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  float local_3f0;
  float local_3c0;
  uint local_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  string local_398 [32];
  uchar *local_378;
  uchar *puStack_370;
  size_t local_368;
  uchar *puStack_360;
  uchar *local_358;
  uchar *puStack_350;
  size_t local_348;
  uchar *puStack_340;
  uchar *local_338;
  uchar *puStack_330;
  size_t local_328;
  uchar *puStack_320;
  uchar *local_318;
  float local_310;
  float local_30c;
  v_array<float> *local_308;
  float local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  byte local_2e5;
  uint local_2d4;
  uchar *local_2d0;
  ostream local_2c8;
  vw *in_stack_fffffffffffffe48;
  nn *in_stack_fffffffffffffe50;
  undefined4 local_114;
  undefined1 local_100 [104];
  undefined4 local_98;
  undefined4 local_94;
  byte local_19;
  v_array<unsigned_char> *local_18;
  uint *local_8;
  
  local_19 = 0 < *(int *)(*(long *)(in_RDI + 0x4eb4) + 0x3530);
  local_3b8 = in_stack_fffffffffffffbb8;
  uStack_3b4 = in_stack_fffffffffffffbbc;
  uStack_3b0 = in_stack_fffffffffffffbc0;
  uStack_3ac = in_stack_fffffffffffffbc4;
  local_3a8 = in_stack_fffffffffffffbc8;
  uStack_3a4 = in_stack_fffffffffffffbcc;
  uStack_3a0 = in_stack_fffffffffffffbd0;
  uStack_39c = in_stack_fffffffffffffbd4;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if ((*(byte *)((long)in_RDI + 0x13aa9) & 1) == 0) {
    finish_setup(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_3b8 = in_stack_fffffffffffffbb8;
    uStack_3b4 = in_stack_fffffffffffffbbc;
    uStack_3b0 = in_stack_fffffffffffffbc0;
    uStack_3ac = in_stack_fffffffffffffbc4;
    local_3a8 = in_stack_fffffffffffffbc8;
    uStack_3a4 = in_stack_fffffffffffffbcc;
    uStack_3a0 = in_stack_fffffffffffffbd0;
    uStack_39c = in_stack_fffffffffffffbd4;
  }
  memcpy(local_100,(void *)**(undefined8 **)(local_8 + 0x4eb4),0xe0);
  uVar3 = **(undefined8 **)(local_8 + 0x4eb4);
  **(long **)(local_8 + 0x4eb4) = (long)local_100;
  puVar4 = local_18[0x341]._end;
  uVar5 = *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40);
  local_3c0 = 2.0;
  if ((local_8[0x4ea4] & 1) == 0) {
    local_3c0 = 1.0;
  }
  uVar6 = *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548);
  lVar7 = *(long *)(local_8 + 0x4eb0);
  lVar8 = *(long *)(local_8 + 0x4eae);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
  *(code **)(*(long *)(local_8 + 0x4eb4) + 0x40) = noop_mm;
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = *(undefined8 *)(local_8 + 2);
  uVar1 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68);
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = 0xc0400000;
  uVar2 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c);
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = 0x40400000;
  local_2d0 = local_18[0x341]._begin;
  if ((*(byte *)((long)local_8 + 0x13aaa) & 1) != 0) {
    local_18[0x341]._begin = (uchar *)0x0;
  }
  *(uchar **)(local_8 + 0x3440) = local_18[0x341]._begin;
  if ((local_19 & 1) != 0) {
    for (local_2d4 = 0; local_2d4 < *local_8; local_2d4 = local_2d4 + 1) {
      if (local_2d4 != 0) {
        std::operator<<(&local_2c8,' ');
      }
      poVar19 = (ostream *)std::ostream::operator<<(&local_2c8,local_2d4);
      poVar19 = std::operator<<(poVar19,':');
      poVar19 = (ostream *)
                std::ostream::operator<<(poVar19,*(float *)(lVar7 + (ulong)local_2d4 * 0x20));
      poVar19 = std::operator<<(poVar19,',');
      fVar22 = fasttanh(0.0);
      std::ostream::operator<<(poVar19,fVar22);
    }
  }
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = uVar6;
  *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40) = uVar5;
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = uVar1;
  *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = uVar2;
  local_18[0x341]._begin = local_2d0;
  local_2e5 = 0;
  local_2ec = 0;
  local_2f0 = 0;
  local_2f4 = 0;
  while( true ) {
    local_8[0x1a31] = 0x3f800000;
    local_8[0xd3e] = 0x3f800000;
    *(uchar **)(local_8 + 0x4e74) = local_18[0x341]._begin;
    *(code **)(*(long *)(local_8 + 0x4eb4) + 0x40) = noop_mm;
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = *(undefined8 *)(local_8 + 2);
    uVar1 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68);
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = 0xbf800000;
    uVar2 = *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c);
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = 0x3f800000;
    for (local_2f8 = 0; local_2f8 < *local_8; local_2f8 = local_2f8 + 1) {
      if ((*(byte *)(lVar8 + (ulong)local_2f8) & 1) == 0) {
        local_3f0 = fasttanh(0.0);
        local_3f0 = local_3c0 * local_3f0;
      }
      else {
        local_3f0 = 0.0;
      }
      local_2fc = local_3f0;
      local_308 = (v_array<float> *)(local_8 + 0xd26);
      pfVar20 = v_array<float>::operator[](local_308,(ulong)local_2f8);
      *pfVar20 = local_3f0;
      local_8[0x1a31] = (uint)(local_2fc * local_2fc + (float)local_8[0x1a31]);
      *(float *)&local_308[3]._begin = local_2fc * local_2fc + *(float *)&local_308[3]._begin;
      puVar21 = v_array<unsigned_long>::operator[]
                          ((v_array<unsigned_long> *)(local_308 + 1),(ulong)local_2f8);
      uVar9 = *puVar21;
      puVar21 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(local_8 + 0x4196),0);
      *puVar21 = uVar9;
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)CONCAT44(uStack_39c,uStack_3a0),
                 (example *)CONCAT44(uStack_3a4,local_3a8),CONCAT44(uStack_3ac,uStack_3b0));
      local_30c = (float)local_8[0x4e80];
      if ((local_30c == 0.0) && (!NAN(local_30c))) {
        dVar11 = std::sqrt((double)(ulong)(uint)(float)*local_8);
        local_310 = SUB84(dVar11,0);
        fVar22 = merand48((uint64_t *)CONCAT44(uStack_3ac,uStack_3b0));
        local_8[0x4e76] = (uint)((fVar22 + -0.5) / local_310);
        LEARNER::learner<char,_example>::update
                  ((learner<char,_example> *)CONCAT44(uStack_39c,uStack_3a0),
                   (example *)CONCAT44(uStack_3a4,local_3a8),CONCAT44(uStack_3ac,uStack_3b0));
        local_8[0x4e76] = 0x7f7fffff;
      }
    }
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x3548) = uVar6;
    *(undefined8 *)(*(long *)(local_8 + 0x4eb4) + 0x40) = uVar5;
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x68) = uVar1;
    *(undefined4 *)(**(long **)(local_8 + 0x4eb4) + 0x6c) = uVar2;
    if ((local_8[0x4eaa] & 1) == 0) {
      *(uchar **)(local_8 + 0x1a0c) = local_18[0x341]._begin;
      *(uchar **)(local_8 + 0x1a16) = local_18[0x342]._end;
      puVar12 = local_18[0x341]._end;
      puVar13 = local_18[0x341].end_array;
      puVar15 = local_18[0x342]._begin;
      *(size_t *)(local_8 + 0x1a12) = local_18[0x341].erase_count;
      *(uchar **)(local_8 + 0x1a14) = puVar15;
      *(uchar **)(local_8 + 0x1a0e) = puVar12;
      *(uchar **)(local_8 + 0x1a10) = puVar13;
      local_8[0x1a20] = *(uint *)&local_18[0x343].end_array;
      local_8[0x1a2e] = 0;
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)CONCAT44(uStack_39c,uStack_3a0),
                 (example *)CONCAT44(uStack_3a4,local_3a8),CONCAT44(uStack_3ac,uStack_3b0));
      memcpy(&local_18[0x341]._end,local_8 + 0x1a0e,0x28);
    }
    else {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)CONCAT44(uStack_3ac,uStack_3b0),
                 (uchar *)CONCAT44(uStack_3b4,local_3b8));
      local_318 = local_18[0x1a7]._end;
      local_328 = local_18[0x1a6].erase_count;
      puStack_320 = local_18[0x1a7]._begin;
      local_338 = local_18[0x1a6]._end;
      puStack_330 = local_18[0x1a6].end_array;
      local_378 = local_18[0x1a4]._end;
      puStack_370 = local_18[0x1a4].end_array;
      local_368 = local_18[0x1a4].erase_count;
      puStack_360 = local_18[0x1a5]._begin;
      local_358 = local_18[0x1a5]._end;
      puStack_350 = local_18[0x1a5].end_array;
      local_348 = local_18[0x1a5].erase_count;
      puStack_340 = local_18[0x1a6]._begin;
      *(uint *)&local_18[0x1a7]._end = local_8[0xd3e];
      puVar12 = *(uchar **)(local_8 + 0xd3c);
      local_18[0x1a6].erase_count = *(size_t *)(local_8 + 0xd3a);
      local_18[0x1a7]._begin = puVar12;
      puVar12 = *(uchar **)(local_8 + 0xd38);
      local_18[0x1a6]._end = *(uchar **)(local_8 + 0xd36);
      local_18[0x1a6].end_array = puVar12;
      puVar12 = *(uchar **)(local_8 + 0xd26);
      puVar13 = *(uchar **)(local_8 + 0xd28);
      sVar14 = *(size_t *)(local_8 + 0xd2a);
      puVar15 = *(uchar **)(local_8 + 0xd2c);
      puVar16 = *(uchar **)(local_8 + 0xd2e);
      puVar17 = *(uchar **)(local_8 + 0xd30);
      puVar18 = *(uchar **)(local_8 + 0xd34);
      local_18[0x1a5].erase_count = *(size_t *)(local_8 + 0xd32);
      local_18[0x1a6]._begin = puVar18;
      local_18[0x1a5]._end = puVar16;
      local_18[0x1a5].end_array = puVar17;
      local_18[0x1a4].erase_count = sVar14;
      local_18[0x1a5]._begin = puVar15;
      local_18[0x1a4]._end = puVar12;
      local_18[0x1a4].end_array = puVar13;
      *(float *)((long)&local_18[0x345].end_array + 4) =
           *(float *)((long)&local_18[0x345].end_array + 4) + (float)local_8[0xd3e];
      LEARNER::learner<char,_example>::predict
                ((learner<char,_example> *)CONCAT44(uStack_39c,uStack_3a0),
                 (example *)CONCAT44(uStack_3a4,local_3a8),CONCAT44(uStack_3ac,uStack_3b0));
      local_8[0x1a2e] = *(uint *)&local_18[0x345]._end;
      local_8[0x1a30] = *(uint *)&local_18[0x345].end_array;
      *(float *)((long)&local_18[0x345].end_array + 4) =
           *(float *)((long)&local_18[0x345].end_array + 4) - (float)local_8[0xd3e];
      *(undefined4 *)&local_18[0x1a7]._end = 0;
      memcpy(&local_18[0x1a4]._end,&local_378,100);
      v_array<unsigned_char>::pop(local_18);
    }
    fVar22 = GD::finalize_prediction((shared_data *)CONCAT44(uStack_3b4,local_3b8),0.0);
    local_8[0x4ea0] = (uint)fVar22;
    if ((local_19 & 1) != 0) {
      poVar19 = std::operator<<(&local_2c8,' ');
      std::ostream::operator<<(poVar19,(float)local_8[0x1a2e]);
      pcVar10 = *(code **)(*(long *)(local_8 + 0x4eb4) + 0x3540);
      uVar1 = *(undefined4 *)(*(long *)(local_8 + 0x4eb4) + 0x3530);
      std::__cxx11::ostringstream::str();
      local_3b8 = (undefined4)local_18[0x343].erase_count;
      uStack_3b4 = (undefined4)(local_18[0x343].erase_count >> 0x20);
      uStack_3b0 = SUB84(local_18[0x344]._begin,0);
      uStack_3ac = (undefined4)((ulong)local_18[0x344]._begin >> 0x20);
      local_3a8 = SUB84(local_18[0x344]._end,0);
      uStack_3a4 = (undefined4)((ulong)local_18[0x344]._end >> 0x20);
      uStack_3a0 = SUB84(local_18[0x344].end_array,0);
      uStack_39c = (undefined4)((ulong)local_18[0x344].end_array >> 0x20);
      (*pcVar10)(uVar1,local_398);
      std::__cxx11::string::~string(local_398);
    }
    local_114 = SUB84(puVar4,0);
    *(undefined4 *)&local_18[0x341]._end = local_114;
    if ((local_2e5 & 1) == 0) {
      local_2ec = local_8[0x1a2e];
      local_2f0 = local_8[0x4ea0];
      local_2f4 = local_8[0x1a30];
    }
    if (((local_8[0x4ea4] & 1) == 0) || ((local_2e5 & 1) != 0)) break;
    for (local_3bc = 0; local_3bc < *local_8; local_3bc = local_3bc + 1) {
      *(byte *)(lVar8 + (ulong)local_3bc) = (*(byte *)(lVar8 + (ulong)local_3bc) ^ 0xff) & 1;
    }
    local_2e5 = 1;
  }
  *(uint *)&local_18[0x345]._end = local_2ec;
  *(uint *)&local_18[0x342].end_array = local_2f0;
  *(uint *)&local_18[0x345].end_array = local_2f4;
  **(undefined8 **)(local_8 + 0x4eb4) = uVar3;
  (*(code *)(*(undefined8 **)(local_8 + 0x4eb4))[8])(local_98,**(undefined8 **)(local_8 + 0x4eb4));
  (*(code *)(*(undefined8 **)(local_8 + 0x4eb4))[8])(local_94,**(undefined8 **)(local_8 + 0x4eb4));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}